

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::str_writer<char>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
           *this,align_spec *spec,str_writer<char> *f)

{
  __type _Var1;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> __first;
  unsigned_long __n;
  char_type fill;
  wchar_t local_2c;
  
  __n = (ulong)spec->width_ - f->size_;
  if ((ulong)spec->width_ < f->size_ || __n == 0) {
    str_writer<char>::operator()
              ((str_writer<char> *)f,
               (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
    return;
  }
  local_2c = spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    _Var1 = std::
            __fill_n_a1<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                      (*(vector<wchar_t,_std::allocator<wchar_t>_> **)this,__n >> 1,&local_2c);
    *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = _Var1.container;
    str_writer<char>::operator()
              ((str_writer<char> *)f,
               (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
    __first.container = *(vector<wchar_t,_std::allocator<wchar_t>_> **)this;
    __n = __n - (__n >> 1);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      _Var1 = std::
              __fill_n_a1<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                        (*(vector<wchar_t,_std::allocator<wchar_t>_> **)this,__n,&local_2c);
      *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = _Var1.container;
      str_writer<char>::operator()
                ((str_writer<char> *)f,
                 (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
      return;
    }
    str_writer<char>::operator()
              ((str_writer<char> *)f,
               (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
    __first.container = *(vector<wchar_t,_std::allocator<wchar_t>_> **)this;
  }
  _Var1 = std::
          __fill_n_a1<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                    (__first,__n,&local_2c);
  *(vector<wchar_t,_std::allocator<wchar_t>_> **)this = _Var1.container;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }